

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_strtoi(char *str,char **endptr)

{
  bool bVar1;
  int local_34;
  char *pcStack_30;
  int value;
  char *p;
  int neg;
  char **endptr_local;
  char *str_local;
  
  p._4_4_ = 1;
  local_34 = 0;
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0xda8,"int nk_strtoi(const char *, char **)");
  }
  pcStack_30 = str;
  if (str == (char *)0x0) {
    str_local._4_4_ = 0;
  }
  else {
    for (; *pcStack_30 == ' '; pcStack_30 = pcStack_30 + 1) {
    }
    if (*pcStack_30 == '-') {
      p._4_4_ = -1;
      pcStack_30 = pcStack_30 + 1;
    }
    while( true ) {
      bVar1 = false;
      if ((*pcStack_30 != '\0') && (bVar1 = false, '/' < *pcStack_30)) {
        bVar1 = *pcStack_30 < ':';
      }
      if (!bVar1) break;
      local_34 = local_34 * 10 + *pcStack_30 + -0x30;
      pcStack_30 = pcStack_30 + 1;
    }
    if (endptr != (char **)0x0) {
      *endptr = pcStack_30;
    }
    str_local._4_4_ = p._4_4_ * local_34;
  }
  return str_local._4_4_;
}

Assistant:

NK_API int
nk_strtoi(const char *str, char **endptr)
{
    int neg = 1;
    const char *p = str;
    int value = 0;

    NK_ASSERT(str);
    if (!str) return 0;

    /* skip whitespace */
    while (*p == ' ') p++;
    if (*p == '-') {
        neg = -1;
        p++;
    }
    while (*p && *p >= '0' && *p <= '9') {
        value = value * 10 + (int) (*p - '0');
        p++;
    }
    if (endptr)
        *endptr = (char*)p;
    return neg*value;
}